

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O0

void t9(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  char *script;
  uint32_t p [10];
  int e;
  int c;
  int oc;
  int s;
  char *in_stack_ffffffffffffffb8;
  char *pcVar4;
  int pc;
  int iVar5;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint local_14;
  
  pcVar4 = "   ld p9 p0   tag 0   w p1 1   mils 5   w p1 0   mils 5   dcr p9   jp 0";
  printf("Script store/run/status/stop/delete tests.\n");
  gpioWrite(0x19,0);
  t9_count = 0;
  gpioSetAlertFunc(0x19,t9cbf);
  uVar1 = gpioStoreScript(pcVar4);
  do {
    time_sleep(0x3fb999999999999a);
    iVar2 = gpioScriptStatus(uVar1,&stack0xffffffffffffffc8);
  } while (iVar2 == 0);
  iVar2 = 99;
  iVar5 = 0x19;
  gpioRunScript(uVar1,2,&stack0xffffffffffffffc8);
  time_sleep(0x4000000000000000);
  CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar5,iVar2,(int)((ulong)pcVar4 >> 0x20)
        ,in_stack_ffffffffffffffb8);
  iVar2 = 200;
  iVar5 = 0x19;
  gpioRunScript(uVar1,2,&stack0xffffffffffffffc8);
  time_sleep(0x3fb999999999999a);
  while (iVar3 = gpioScriptStatus(uVar1,&stack0xffffffffffffffc8), iVar3 == 2) {
    time_sleep(0x3fe0000000000000);
  }
  time_sleep(0x3fb999999999999a);
  CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar5,iVar2,(int)((ulong)pcVar4 >> 0x20)
        ,in_stack_ffffffffffffffb8);
  iVar2 = 2000;
  iVar5 = 0x19;
  gpioRunScript(uVar1,2,&stack0xffffffffffffffc8);
  time_sleep(0x3fb999999999999a);
  while( true ) {
    iVar3 = gpioScriptStatus(uVar1,&stack0xffffffffffffffc8);
    pc = (int)((ulong)pcVar4 >> 0x20);
    if (iVar3 != 2) break;
    if (local_14 < 0x76c) {
      gpioStopScript(uVar1);
    }
    time_sleep(0x3fb999999999999a);
  }
  time_sleep(0x3fb999999999999a);
  CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar5,iVar2,pc,in_stack_ffffffffffffffb8
       );
  gpioDeleteScript(uVar1);
  CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar5,iVar2,pc,in_stack_ffffffffffffffb8
       );
  return;
}

Assistant:

void t9()
{
   int s, oc, c, e;
   uint32_t p[10];

   /*
   100 loops per second
   p0 number of loops
   p1 GPIO
   */
   char *script="\
   ld p9 p0\
   tag 0\
   w p1 1\
   mils 5\
   w p1 0\
   mils 5\
   dcr p9\
   jp 0";

   printf("Script store/run/status/stop/delete tests.\n");

   gpioWrite(GPIO, 0); /* need known state */

   t9_count = 0;

   gpioSetAlertFunc(GPIO, t9cbf);

   s = gpioStoreScript(script);

   while (1)
   {
      /* loop until script initialised */
      time_sleep(0.1);
      e = gpioScriptStatus(s, p);
      if (e != PI_SCRIPT_INITING) break;
   }

   oc = t9_count;
   p[0] = 99;
   p[1] = GPIO;
   gpioRunScript(s, 2, p);
   time_sleep(2);
   c = t9_count - oc;
   CHECK(9, 1, c, 100, 0, "store/run script");

   oc = t9_count;
   p[0] = 200;
   p[1] = GPIO;
   gpioRunScript(s, 2, p);
   time_sleep(0.1);
   while (1)
   {
      e = gpioScriptStatus(s, p);
      if (e != PI_SCRIPT_RUNNING) break;
      time_sleep(0.5);
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 2, c, 201, 0, "run script/script status");

   oc = t9_count;
   p[0] = 2000;
   p[1] = GPIO;
   gpioRunScript(s, 2, p);
   time_sleep(0.1);
   while (1)
   {
      e = gpioScriptStatus(s, p);
      if (e != PI_SCRIPT_RUNNING) break;
      if (p[9] < 1900) gpioStopScript(s);
      time_sleep(0.1);
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 3, c, 110, 10, "run/stop script/script status");

   e = gpioDeleteScript(s);
   CHECK(9, 4, e, 0, 0, "delete script");
}